

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall Fl_Text_Display::rewind_lines(Fl_Text_Display *this,int startPos,int nLines)

{
  int local_48;
  int local_44;
  int retLineEnd;
  int retLineStart;
  int retPos;
  int retLines;
  int lineStart;
  int pos;
  Fl_Text_Buffer *buf;
  int nLines_local;
  int startPos_local;
  Fl_Text_Display *this_local;
  
  buf._0_4_ = nLines;
  buf._4_4_ = startPos;
  _nLines_local = this;
  _lineStart = buffer(this);
  if (this->mContinuousWrap == 0) {
    this_local._4_4_ = Fl_Text_Buffer::rewind_lines(_lineStart,buf._4_4_,(int)buf);
  }
  else {
    retLines = buf._4_4_;
    while( true ) {
      retPos = Fl_Text_Buffer::line_start(_lineStart,retLines);
      wrapped_line_counter
                (this,_lineStart,retPos,retLines,0x7fffffff,true,0,&retLineEnd,&retLineStart,
                 &local_44,&local_48,false);
      if ((int)buf < retLineStart) break;
      retLines = retPos + -1;
      if (retLines < 0) {
        return 0;
      }
      buf._0_4_ = ((int)buf - retLineStart) + -1;
    }
    this_local._4_4_ = skip_lines(this,retPos,retLineStart - (int)buf,true);
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::rewind_lines(int startPos, int nLines) {
  IS_UTF8_ALIGNED2(buffer(), startPos)

  Fl_Text_Buffer *buf = buffer();
  int pos, lineStart, retLines, retPos, retLineStart, retLineEnd;

  /* If we're not wrapping, use the more efficient BufCountBackwardNLines */
  if (!mContinuousWrap)
    return buf->rewind_lines(startPos, nLines);

  pos = startPos;
  for (;;) {
    lineStart = buf->line_start(pos);
    wrapped_line_counter(buf, lineStart, pos, INT_MAX, true, 0,
                         &retPos, &retLines, &retLineStart, &retLineEnd, false);
    if (retLines > nLines)
      return skip_lines(lineStart, retLines-nLines, true);
    nLines -= retLines;
    pos = lineStart - 1;
    if (pos < 0)
      return 0;
    nLines -= 1;
  }
}